

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

float64 vector_vqgen(float32 **data,int32 rows,int32 cols,int32 vqrows,float64 epsilon,int32 maxiter
                    ,float32 **mean,int32 *map,int32 seed)

{
  int *piVar1;
  size_t __n;
  uint uVar2;
  float32 *pfVar3;
  float32 *pfVar4;
  int32 iVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  unsigned_long s;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  float64 t;
  ptmr_t tm;
  uint local_d4;
  double local_98;
  int local_8c;
  ulong local_88;
  float32 *local_80;
  float64 local_78;
  size_t local_70;
  ptmr_t local_68;
  
  local_78 = epsilon;
  if ((((double)epsilon <= 0.0) || (rows < vqrows)) || (maxiter < 0)) {
    __assert_fail("(rows >= vqrows) && (maxiter >= 0) && (epsilon > 0.0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                  ,0x191,
                  "float64 vector_vqgen(float32 **, int32, int32, int32, float64, int32, float32 **, int32 *, int32)"
                 );
  }
  iVar9 = rows + 0x3e;
  if (-1 < rows + 0x1f) {
    iVar9 = rows + 0x1f;
  }
  pvVar6 = __ckd_calloc__((long)(iVar9 >> 5),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                          ,0x193);
  ptmr_init(&local_68);
  ptmr_start(&local_68);
  if (seed < 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
            ,0x19d,"You are using the internal mechanism of vector_vqgen to decide the seed.  \n");
    uVar7 = time((time_t *)0x0);
    s = uVar7 & 0xffffffff;
  }
  else {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
            ,0x1a7,"You are using %d as the seed \n",(ulong)(uint)seed);
    s = (unsigned_long)(uint)seed;
  }
  genrand_seed(s);
  __n = (long)cols * 4;
  uVar7 = (ulong)(uint)vqrows;
  if (0 < vqrows) {
    uVar12 = 0;
    do {
      lVar8 = genrand_int31();
      uVar15 = (long)(ulong)((uint)lVar8 & 0x7fffffff) % (long)rows;
      uVar11 = uVar15 & 0xffffffff;
      uVar14 = uVar11 >> 5;
      uVar2 = *(uint *)((long)pvVar6 + uVar14 * 4);
      uVar13 = (uint)(1L << ((byte)uVar15 & 0x1f));
      for (uVar10 = uVar2 >> ((uint)uVar15 & 0x1f); (uVar10 & 1) != 0;
          uVar10 = uVar2 >> (uVar10 & 0x1f)) {
        uVar10 = (int)uVar11 + 1;
        if (rows <= (int)uVar10) {
          uVar10 = 0;
        }
        uVar11 = (ulong)uVar10;
        uVar14 = (ulong)(uVar10 >> 5);
        uVar2 = *(uint *)((long)pvVar6 + uVar14 * 4);
        uVar13 = (uint)(1L << ((byte)uVar10 & 0x1f));
      }
      *(uint *)((long)pvVar6 + uVar14 * 4) = uVar13 | uVar2;
      memcpy(mean[uVar12],data[uVar11],__n);
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar7);
  }
  ckd_free(pvVar6);
  pvVar6 = __ckd_calloc__((long)vqrows,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                          ,0x1bf);
  local_80 = (float32 *)
             __ckd_calloc__((long)cols,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                            ,0x1c2);
  vector_mean(local_80,mean,vqrows,cols);
  local_8c = maxiter + -1;
  uVar12 = (ulong)(uint)cols;
  local_70 = uVar12 * 4;
  local_88 = (ulong)(uint)rows;
  local_d4 = 0;
  dVar16 = 0.0;
  do {
    uVar15 = local_88;
    dVar17 = 0.0;
    if (0 < rows) {
      uVar14 = 0;
      do {
        iVar5 = vector_vqlabel(data[uVar14],mean,vqrows,cols,(float64 *)&local_98);
        map[uVar14] = iVar5;
        dVar17 = dVar17 + local_98;
        uVar14 = uVar14 + 1;
      } while (uVar15 != uVar14);
    }
    ptmr_stop(&local_68);
    if (local_d4 == 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
              ,0x1d0,"Iter %4d: %.1fs CPU; sqerr= %e\n",local_68.t_cpu,dVar17,0);
      if (((dVar17 == 0.0) && (!NAN(dVar17))) || (maxiter < 2)) {
LAB_0012024d:
        ckd_free(pvVar6);
        ckd_free(local_80);
        return (float64)dVar17;
      }
    }
    else {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
              ,0x1d3,"Iter %4d: %.1fs CPU; sqerr= %e; delta= %e\n",local_68.t_cpu,dVar17,
              (ulong)local_d4);
      if (((dVar17 == 0.0) && (!NAN(dVar17))) ||
         ((local_8c <= (int)local_d4 || ((dVar16 - dVar17) / dVar16 < (double)local_78))))
      goto LAB_0012024d;
    }
    ptmr_start(&local_68);
    if (0 < vqrows) {
      uVar15 = 0;
      do {
        if (0 < cols) {
          memset(mean[uVar15],0,local_70);
        }
        *(undefined4 *)((long)pvVar6 + uVar15 * 4) = 0;
        uVar15 = uVar15 + 1;
      } while (uVar7 != uVar15);
    }
    if (0 < rows) {
      uVar15 = 0;
      do {
        iVar9 = map[uVar15];
        if (0 < cols) {
          pfVar3 = mean[iVar9];
          pfVar4 = data[uVar15];
          uVar14 = 0;
          do {
            pfVar3[uVar14] = (float32)((float)pfVar4[uVar14] + (float)pfVar3[uVar14]);
            uVar14 = uVar14 + 1;
          } while (uVar12 != uVar14);
        }
        piVar1 = (int *)((long)pvVar6 + (long)iVar9 * 4);
        *piVar1 = *piVar1 + 1;
        uVar15 = uVar15 + 1;
      } while (uVar15 != local_88);
    }
    if (0 < vqrows) {
      uVar15 = 0;
      do {
        iVar9 = *(int *)((long)pvVar6 + uVar15 * 4);
        if (iVar9 < 2) {
          if (iVar9 == 0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                    ,0x1ef,"Iter %d: mean[%d] unmapped\n",(ulong)local_d4,uVar15 & 0xffffffff);
            memcpy(mean[uVar15],local_80,__n);
          }
        }
        else {
          local_98 = 1.0 / (double)iVar9;
          if (0 < cols) {
            pfVar3 = mean[uVar15];
            uVar14 = 0;
            do {
              pfVar3[uVar14] = (float32)(float)((double)(float)pfVar3[uVar14] * local_98);
              uVar14 = uVar14 + 1;
            } while (uVar12 != uVar14);
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar7);
    }
    local_d4 = local_d4 + 1;
    dVar16 = dVar17;
  } while( true );
}

Assistant:

float64
vector_vqgen(float32 ** data, int32 rows, int32 cols, int32 vqrows,
             float64 epsilon, int32 maxiter,
             float32 ** mean, int32 * map, int32 seed)
{
    int32 i, j, r, it;
    float64 sqerr, prev_sqerr = 0, t;
    bitvec_t *sel;
    int32 *count;
    float32 *gmean;
    ptmr_t tm;

    assert((rows >= vqrows) && (maxiter >= 0) && (epsilon > 0.0));

    sel = bitvec_alloc(rows);

    ptmr_init(&tm);
    ptmr_start(&tm);


    /* Pick a random initial set of centroids */

    if (seed < 0) {
        E_INFO
            ("You are using the internal mechanism of vector_vqgen to decide the seed.  \n");
        s3_rand_seed((unsigned) time(NULL));

    }
    else {

        /*ARCHAN: DON'T delete this line! This will always give the
           experimenter the seed they were using in their experiments. This
           make the result be repeatable */

        E_INFO("You are using %d as the seed \n", seed);
        s3_rand_seed(seed);
    }


    for (i = 0; i < vqrows; i++) {
        /* Find r = a random, previously unselected row from the input */

        r = (s3_rand_int31() & (int32) 0x7fffffff) % rows;

        /*        r = (rand() & (int32)0x7fffffff) % rows; */

        while (bitvec_is_set(sel, r)) { /* BUG: possible infinite loop!! */
            if (++r >= rows)
                r = 0;
        }
        bitvec_set(sel, r);

        memcpy((void *) (mean[i]), (void *) (data[r]),
               cols * sizeof(float32));
        /* BUG: What if two randomly selected rows are identical in content?? */
    }
    bitvec_free(sel);

    count = (int32 *) ckd_calloc(vqrows, sizeof(int32));

    /* In k-means, unmapped means in any iteration are a problem.  Replace them with gmean */
    gmean = (float32 *) ckd_calloc(cols, sizeof(float32));
    vector_mean(gmean, mean, vqrows, cols);

    for (it = 0;; it++) {       /* Iterations of k-means algorithm */
        /* Find the current data->mean mappings (labels) */
        sqerr = 0.0;
        for (i = 0; i < rows; i++) {
            map[i] = vector_vqlabel(data[i], mean, vqrows, cols, &t);
            sqerr += t;
        }
        ptmr_stop(&tm);

        if (it == 0)
            E_INFO("Iter %4d: %.1fs CPU; sqerr= %e\n", it, tm.t_cpu,
                   sqerr);
        else
            E_INFO("Iter %4d: %.1fs CPU; sqerr= %e; delta= %e\n",
                   it, tm.t_cpu, sqerr, (prev_sqerr - sqerr) / prev_sqerr);

        /* Check if exit condition satisfied */
        if ((sqerr == 0.0) || (it >= maxiter - 1) ||
            ((it > 0) && (((prev_sqerr - sqerr) / prev_sqerr) < epsilon)))
            break;
        prev_sqerr = sqerr;

        ptmr_start(&tm);

        /* Update (reestimate) means */
        for (i = 0; i < vqrows; i++) {
            for (j = 0; j < cols; j++)
                mean[i][j] = 0.0;
            count[i] = 0;
        }
        for (i = 0; i < rows; i++) {
            vector_accum(mean[map[i]], data[i], cols);
            count[map[i]]++;
        }
        for (i = 0; i < vqrows; i++) {
            if (count[i] > 1) {
                t = 1.0 / (float64) (count[i]);
                for (j = 0; j < cols; j++)
                    /*              mean[i][j] *= t; *//* RAH, compiler was complaining about this,  */
                    mean[i][j] = (float32) ((float64) mean[i][j] * (float64) t);        /*  */
            }
            else if (count[i] == 0) {
                E_ERROR("Iter %d: mean[%d] unmapped\n", it, i);
                memcpy(mean[i], gmean, cols * sizeof(float32));
            }
        }
    }

    ckd_free(count);
    ckd_free(gmean);

    return sqerr;
}